

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ostream *filename;
  ostream *poVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  long in_RSI;
  bool res;
  int i_1;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  counter;
  int warmup;
  longlong i;
  PathOram oram;
  longlong N;
  int cap;
  int logN;
  int in_stack_ffffffffffffea18;
  int in_stack_ffffffffffffea1c;
  TreeOram *in_stack_ffffffffffffea20;
  allocator *in_stack_ffffffffffffea28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea50;
  ostream *in_stack_ffffffffffffea58;
  undefined7 in_stack_ffffffffffffea60;
  long local_1590;
  undefined4 in_stack_ffffffffffffea98;
  char *pcVar8;
  allocator local_1531;
  string local_1530 [39];
  allocator local_1509;
  string local_1508 [32];
  string local_14e8 [32];
  string local_14c8 [32];
  long local_14a8;
  byte local_149d;
  int local_149c;
  int local_1464;
  long local_1460;
  PathOram local_1458;
  long local_80;
  allocator local_71;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  undefined4 local_4;
  
  local_4 = 0;
  pcVar8 = *(char **)(in_RSI + 8);
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar8,&local_39);
  iVar2 = std::__cxx11::stoi((string *)in_stack_ffffffffffffea20,
                             (size_t *)CONCAT44(in_stack_ffffffffffffea1c,in_stack_ffffffffffffea18)
                             ,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar8 = *(char **)(local_10 + 0x10);
  local_14 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar8,&local_71);
  iVar2 = std::__cxx11::stoi((string *)in_stack_ffffffffffffea20,
                             (size_t *)CONCAT44(in_stack_ffffffffffffea1c,in_stack_ffffffffffffea18)
                             ,0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = (long)(1 << ((byte)local_14 & 0x1f));
  local_50 = iVar2;
  PathOram::PathOram((PathOram *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea1c,
                     in_stack_ffffffffffffea18);
  local_1460 = 0;
  local_1464 = 0x100000;
  std::
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  ::map((map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
         *)0x108a66);
  filename = std::operator<<((ostream *)&std::cout,"Starting warmming up with ");
  poVar5 = (ostream *)std::ostream::operator<<(filename,local_1464);
  poVar6 = std::operator<<(poVar5," operations.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_149c = 0;
  while( true ) {
    if (local_1464 < local_80) {
      local_1590 = local_80;
    }
    else {
      local_1590 = (long)local_1464;
    }
    if (local_1590 <= local_149c) break;
    PathOram::access(&local_1458,(char *)((long)local_149c % local_80 & 0xffffffff),
                     (int)((long)local_149c % local_80));
    local_149c = local_149c + 1;
  }
  local_1460 = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,"Warmup completed.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  do {
    uVar3 = PathOram::access(&local_1458,(char *)(local_1460 % local_80 & 0xffffffff),
                             (int)(local_1460 % local_80));
    bVar1 = (byte)uVar3;
    local_149d = bVar1 & 1;
    if ((uVar3 & 1) == 0) {
      in_stack_ffffffffffffea58 =
           std::operator<<((ostream *)&std::cout,"tree oram invariance is broken");
      in_stack_ffffffffffffea50 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<(in_stack_ffffffffffffea58,local_1460);
      std::ostream::operator<<(in_stack_ffffffffffffea50,std::endl<char,std::char_traits<char>>);
    }
    iVar4 = TreeOram::stash_size(in_stack_ffffffffffffea20);
    local_14a8 = (long)iVar4;
    pmVar7 = std::
             map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             ::operator[]((map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                           *)CONCAT17(bVar1,in_stack_ffffffffffffea60),
                          (key_type *)in_stack_ffffffffffffea58);
    *pmVar7 = *pmVar7 + 1;
    local_1460 = local_1460 + 1;
    if (local_1460 % 1000000 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1508,"path",&local_1509);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20);
      in_stack_ffffffffffffea20 = *(TreeOram **)(local_10 + 8);
      in_stack_ffffffffffffea28 = &local_1531;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1530,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
      pruint64_t((longlong)pcVar8,
                 (map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                  *)CONCAT44(iVar2,in_stack_ffffffffffffea98),(string *)filename,
                 (int)((ulong)poVar5 >> 0x20));
      std::__cxx11::string::~string(local_14c8);
      std::__cxx11::string::~string(local_1530);
      std::allocator<char>::~allocator((allocator<char> *)&local_1531);
      std::__cxx11::string::~string(local_14e8);
      std::__cxx11::string::~string(local_1508);
      std::allocator<char>::~allocator((allocator<char> *)&local_1509);
    }
  } while( true );
}

Assistant:

int main(int argc, char ** argv )
{
   int logN = stoi(string(argv[1]));
   int cap = stoi(string(argv[2]));
   long long N = (1<<logN);
   PathOram oram(logN, cap);
   long long i = 0;
   int warmup = 1<<20;
   map<long long, long long> counter;
   
   cout <<"Starting warmming up with "<<warmup<<" operations."<<endl;
   for(int i = 0; i < (N > warmup ? N : warmup); ++i)
      oram.access(i%N);
   i = 0;
   cout <<"Warmup completed."<<endl;
   while(true)
   {
      bool res = oram.access(i%N);
      if(not res)
      {
         cout<<"tree oram invariance is broken"<<i<<endl;
      }
      ++counter[oram.stash_size()];
      ++i;
      if((i%1000000) == 0)
         pruint64_t(i, counter, string("path")+"_"+string(argv[1]), cap);
   }
}